

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SPPParameter::Clear(SPPParameter *this)

{
  SPPParameter *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    memset(&this->pyramid_height_,0,0xc);
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void SPPParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.SPPParameter)
  if (_has_bits_[0 / 32] & 7u) {
    ::memset(&pyramid_height_, 0, reinterpret_cast<char*>(&engine_) -
      reinterpret_cast<char*>(&pyramid_height_) + sizeof(engine_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}